

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::doRemoveRows(SPxSolverBase<double> *this,int *perm)

{
  SPxStatus SVar1;
  SPxStatus stat;
  
  SPxLPBase<double>::doRemoveRows(&this->super_SPxLPBase<double>,perm);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
  if ((this->super_SPxBasisBase<double>).thestatus < SINGULAR) {
    return;
  }
  SPxBasisBase<double>::removedRows(&this->super_SPxBasisBase<double>,perm);
  SVar1 = (this->super_SPxBasisBase<double>).thestatus;
  stat = REGULAR;
  if ((SVar1 != DUAL) && (SVar1 != INFEASIBLE)) {
    if (SVar1 != OPTIMAL) {
      return;
    }
    stat = PRIMAL;
  }
  setBasisStatus(this,stat);
  return;
}

Assistant:

void SPxSolverBase<R>::doRemoveRows(int perm[])
{

   SPxLPBase<R>::doRemoveRows(perm);

   unInit();

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      this->removedRows(perm);

      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::DUAL:
      case SPxBasisBase<R>::INFEASIBLE:
         setBasisStatus(SPxBasisBase<R>::REGULAR);
         break;

      case SPxBasisBase<R>::OPTIMAL:
         setBasisStatus(SPxBasisBase<R>::PRIMAL);
         break;

      default:
         break;
      }
   }
}